

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
~DrawTestInstance(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  pointer puVar1;
  pointer pPVar2;
  
  (this->super_DrawTestInstanceBase).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawTestInstance_00d32688;
  puVar1 = (this->m_data).super_IndexedParamsBase.indexes.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_data).super_IndexedParamsBase.indexes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pPVar2 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 != (pointer)0x0) {
    operator_delete(pPVar2,(long)(this->m_data).super_DrawParamsBase.vertices.
                                 super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar2);
  }
  DrawTestInstanceBase::~DrawTestInstanceBase(&this->super_DrawTestInstanceBase);
  return;
}

Assistant:

DrawTestInstance<T>::~DrawTestInstance (void)
{
}